

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O2

int Doolittle8(uchar *mat,int *pivot,int n)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int j;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  char cVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uchar *puVar21;
  uint uVar22;
  ulong uVar23;
  int c;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  ulong local_68;
  
  uVar16 = (long)n / 8;
  uVar5 = uVar16 & 0xffffffff;
  iVar4 = (int)uVar16;
  uVar23 = 0;
  if (0 < iVar4) {
    uVar23 = uVar16 & 0xffffffff;
  }
  uVar1 = n - 1;
  lVar15 = (long)iVar4;
  uVar16 = 0;
  if (0 < (int)uVar1) {
    uVar16 = (ulong)uVar1;
  }
  local_68 = 1;
  uVar12 = uVar5;
  uVar25 = 0;
  puVar21 = mat;
  while( true ) {
    if (uVar25 == uVar16) {
      pivot[(int)uVar1] = uVar1;
      return (mat[(long)(iVar4 * n) + -1] & 1) - 1;
    }
    uVar17 = (uint)uVar25;
    pivot[uVar25] = uVar17;
    uVar2 = uVar25 + 1;
    uVar6 = uVar25 >> 3 & 0x1fffffff;
    uVar19 = ~uVar17 & 7;
    lVar7 = uVar25 * lVar15;
    uVar8 = uVar12;
    uVar24 = uVar2;
    while( true ) {
      uVar10 = (uint)uVar24;
      iVar9 = (int)uVar6;
      if ((uint)n <= uVar10) break;
      bVar26 = ((~(uint)mat[uVar6 + lVar7] & (uint)mat[uVar10 * iVar4 + iVar9]) >> uVar19 & 1) != 0;
      for (uVar24 = 0; uVar23 != uVar24; uVar24 = uVar24 + 1) {
        uVar18 = (int)uVar8 + (int)uVar24;
        bVar14 = mat[uVar18];
        bVar3 = (byte)-(uint)bVar26;
        mat[uVar18] = puVar21[uVar24] & bVar3 | bVar26 - 1U & bVar14;
        puVar21[uVar24] = bVar14 & bVar3 | puVar21[uVar24] & bVar26 - 1U;
      }
      uVar18 = 0;
      if (!bVar26) {
        uVar18 = pivot[uVar25];
      }
      pivot[uVar25] = -(uint)bVar26 & uVar10 | uVar18;
      uVar24 = (ulong)(uVar10 + 1);
      uVar8 = uVar8 + uVar5;
    }
    if ((mat[(int)(uVar17 * n) / 8 + iVar9] >> uVar19 & 1) == 0) break;
    uVar10 = (uint)uVar2 & 7;
    uVar18 = (uint)uVar2 >> 3;
    cVar13 = (char)(0x100 >> (sbyte)uVar10);
    for (uVar25 = local_68; uVar25 != (uint)n; uVar25 = uVar25 + 1) {
      lVar20 = uVar25 * lVar15;
      uVar22 = (uint)mat[((int)uVar25 * n) / 8 + iVar9] & 1 << (sbyte)uVar19;
      bVar14 = mat[lVar7 + (ulong)uVar18];
      if (uVar22 == 0) {
        bVar14 = (byte)uVar22;
      }
      mat[lVar20 + (ulong)uVar18] =
           (bVar14 ^ mat[lVar20 + (ulong)uVar18]) & cVar13 - 1U |
           mat[lVar20 + (ulong)uVar18] & -cVar13;
      for (iVar11 = (uVar17 - uVar10) + 9; iVar11 < n; iVar11 = iVar11 + 8) {
        bVar14 = mat[iVar11 / 8 + lVar7];
        if (uVar22 == 0) {
          bVar14 = (byte)uVar22;
        }
        mat[iVar11 / 8 + lVar20] = mat[iVar11 / 8 + lVar20] ^ bVar14;
      }
    }
    local_68 = local_68 + 1;
    puVar21 = puVar21 + lVar15;
    uVar12 = uVar12 + uVar5;
    uVar25 = uVar2;
  }
  return -1;
}

Assistant:

int Doolittle8(unsigned char *mat, int *pivot, int n)
{

  /* LU pseudo code (inplace, without pivoting)
      // n-1 Iterationsschritte
      for k := 1 to n-1
       // Zeilen der Restmatrix werden durchlaufen
       for i := k+1 to n
         // Berechnung von L
         A(i,k) := A(i,k) / A(k,k) // Achtung: vorher Prüfung auf Nullwerte notwendig
         // Spalten der Restmatrix werden durchlaufen
         for j := k+1 to n
           // Berechnung von R
           A(i,j) := A(i,j) - A(i,k) * A(k,j)
   */

  for(int k = 0; k < n-1; k++)
  {

    /*
     * swap rows in constant time ...
     */

    pivot[k] = k;

    unsigned char tmp;
    for(unsigned int j = k+1; j < n; j++)
    {
      unsigned int mask_cpy = (mat[(n/8)*j + k/8] >> (7 - (k % 8))) & 1; // note: type has to be large enough to use as mask with j in pivot computing
      mask_cpy = mask_cpy & !((mat[(n/8)*k + k/8] >> (7 - (k % 8))) & 1);  // add this in order to only actually switch with the first suitable row => consistent with "ref" non-constant-time impl
      mask_cpy = -mask_cpy;
      for(int c = 0; c < n/8; c++)
      {
        tmp = mat[(n/8)*j + c];
        mat[(n/8)*j + c] = (mat[(n/8)*j + c] & ~mask_cpy) | (mat[(n/8)*k + c] & mask_cpy);
        mat[(n/8)*k + c] = (mat[(n/8)*k + c] & ~mask_cpy) | (tmp & mask_cpy);
      }

      // update pivot
      pivot[k] = (j & mask_cpy) | (pivot[k] & ~mask_cpy);
    }

    if (!((mat[k*n/8 + (k/8)] >> (7 - (k % 8))) & 1))
    {
      return -1;
    }

    // for i := k+1 to n
    //      for j := k+1 to n
    //          A(i,j) := A(i,j) - A(i,k) * A(k,j)
    //
    // Bitwise: A(i,j) := A(i,j) ^ A(i,k) & A(k,j)
    // idea: take element A(i,k). It's either 0 or 1. Expand to 8 bits. Multiply with A(k,j), ... A(k,j+7)
    // basically, bit A(i,k) decides whether row A(k) (starting from the k+1'th column) is added to the i+1'th, ..., n'th rows below
    // use a mask for constant time instead of if(bit==1)


    for(int i = k+1; i < n; i++)
    {
      // 0x00 iff A(i,k) is zero. Otherweise 0xFF
      unsigned char mask_ik = 0x00 - ((mat[i*n/8 + (k/8)] >> (7 - (k % 8))) & 1);

      /*
       * First, handle the case that j = k+1 is not divisible by 8; i.e. only handle the last j%8 bits of this byte
       */
      unsigned char mask_prepending = (unsigned char) (0x100 >> ((k+1) % 8)) - 1;

      unsigned char tmp = mat[n/8*i + (k+1)/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      mat[i*(n/8) + (k+1)/8]  ^= (mask_ik & mat[k*(n/8) + (k+1)/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      mat[n/8*i + (k+1)/8] &= mask_prepending;
      mat[n/8*i + (k+1)/8] |= tmp;


      /*
       * now handle the rest of the row efficiently in byte-aligned byte-chunks
       */
      for(int j = k+1 + (8-((k+1)%8)); j < n; j += 8)
      {
        // A(i,j) = A(i,j) + mask_ik * A(k,j)
        // => XOR Bits A(i,j) ... A(i,j+7) with (mask_ik & (A(k,j), ... A(k,j+7))
        mat[i*(n/8) + j/8] ^= mask_ik & mat[k*(n/8) + j/8];
      }
    }
  }
  pivot[n-1] = n-1;

  if ((mat[(n/8)*(n-1) + n/8-1] & 0x01) == 0)
  {
    return -1;
  }
  return 0;
}